

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe(char *source,char *dest,int compressedSize,int maxDecompressedSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte bVar3;
  ushort uVar4;
  undefined8 uVar5;
  ushort uVar6;
  BYTE *s_1;
  ushort *puVar7;
  ushort *__src;
  uint uVar8;
  byte *pbVar9;
  byte *pbVar10;
  ushort *puVar11;
  byte *pbVar12;
  int iVar13;
  BYTE *s;
  byte *pbVar14;
  ushort *puVar15;
  ushort *puVar16;
  ulong uVar17;
  BYTE *e;
  ulong uVar18;
  byte *__dest;
  long lVar19;
  byte *pbVar20;
  ulong uVar21;
  
  iVar13 = -1;
  if (source != (char *)0x0) {
    if (maxDecompressedSize == 0) {
      if (compressedSize == 1) {
        iVar13 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxDecompressedSize);
      puVar15 = (ushort *)source;
      __dest = (byte *)dest;
      if (maxDecompressedSize < 0x40) goto LAB_0010e2c5;
LAB_0010df6f:
      do {
        __src = (ushort *)((long)puVar15 + 1);
        bVar3 = (byte)*puVar15;
        uVar21 = (ulong)(uint)(bVar3 >> 4);
        if (bVar3 >> 4 == 0xf) {
          if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010e248;
          puVar11 = puVar15 + 1;
          uVar8 = 0;
          puVar15 = puVar15 + 8;
          do {
            puVar16 = puVar15;
            puVar7 = __src;
            __src = (ushort *)((long)puVar7 + 1);
            uVar8 = uVar8 + *(byte *)((long)puVar16 + -0xf);
            puVar11 = (ushort *)((long)puVar11 + 1);
            puVar15 = (ushort *)((long)puVar16 + 1);
          } while (puVar16 + -7 < (ushort *)((long)puVar1 - 0xfU) &&
                   *(byte *)((long)puVar16 + -0xf) == 0xff);
          uVar21 = (ulong)uVar8 + 0xf;
          pbVar9 = __dest + uVar21;
          if ((CARRY8((ulong)__dest,uVar21)) || ((ulong)-(long)puVar11 < uVar21)) {
            __src = puVar16 + -7;
            goto LAB_0010e248;
          }
          if (dest + (long)maxDecompressedSize + -0x20 < pbVar9) goto LAB_0010e337;
          puVar15 = (ushort *)((ulong)uVar8 + (long)puVar16 + 1);
          if (puVar1 + -0x10 < puVar15) {
            __src = puVar16 + -7;
            goto LAB_0010e337;
          }
          lVar19 = 0;
          do {
            uVar5 = *(undefined8 *)((byte *)((long)__src + lVar19) + 8);
            pbVar20 = __dest + lVar19;
            *(undefined8 *)pbVar20 = *(undefined8 *)((long)__src + lVar19);
            *(undefined8 *)(pbVar20 + 8) = uVar5;
            pbVar10 = (byte *)((long)puVar7 + lVar19 + 0x11);
            uVar5 = *(undefined8 *)(pbVar10 + 8);
            *(undefined8 *)(pbVar20 + 0x10) = *(undefined8 *)pbVar10;
            *(undefined8 *)(pbVar20 + 0x18) = uVar5;
            lVar19 = lVar19 + 0x20;
          } while (pbVar20 + 0x20 < pbVar9);
        }
        else {
          pbVar9 = __dest + uVar21;
          if ((ushort *)((long)puVar1 - 0x11U) < __src) goto LAB_0010e337;
          uVar5 = *(undefined8 *)((long)puVar15 + 9);
          *(undefined8 *)__dest = *(undefined8 *)__src;
          *(undefined8 *)(__dest + 8) = uVar5;
          puVar15 = (ushort *)(uVar21 + (long)__src);
        }
        uVar4 = *puVar15;
        uVar21 = (ulong)uVar4;
        __src = puVar15 + 1;
        pbVar20 = pbVar9 + -uVar21;
        uVar18 = (ulong)(bVar3 & 0xf);
        if (uVar18 == 0xf) {
          if (pbVar20 < dest) goto LAB_0010e248;
          uVar8 = 0;
          puVar15 = __src;
          do {
            __src = (ushort *)((long)puVar15 + 1);
            if (puVar1 + -2 <= __src) goto LAB_0010e248;
            uVar6 = *puVar15;
            uVar8 = uVar8 + (byte)uVar6;
            puVar15 = __src;
          } while ((byte)uVar6 == 0xff);
          uVar17 = (ulong)uVar8;
          if ((byte *)(-0x10 - uVar17) < pbVar9) goto LAB_0010e248;
          uVar18 = uVar17 + 0x13;
          if (pbVar2 + -0x40 <= pbVar9 + uVar17 + 0x13) goto LAB_0010e3e1;
        }
        else {
          __dest = pbVar9 + uVar18 + 4;
          uVar18 = uVar18 + 4;
          if (pbVar2 + -0x40 <= __dest) goto LAB_0010e3e1;
          if ((dest <= pbVar20) && (7 < uVar4)) {
            *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
            *(undefined8 *)(pbVar9 + 8) = *(undefined8 *)(pbVar20 + 8);
            *(undefined2 *)(pbVar9 + 0x10) = *(undefined2 *)(pbVar20 + 0x10);
            puVar15 = __src;
            goto LAB_0010df6f;
          }
        }
        if (pbVar20 < dest) goto LAB_0010e248;
        __dest = pbVar9 + uVar18;
        puVar15 = __src;
        if (uVar4 < 0x10) {
          if (uVar21 == 4) {
            iVar13 = *(int *)pbVar20;
          }
          else if (uVar4 == 2) {
            iVar13 = CONCAT22(*(undefined2 *)pbVar20,*(undefined2 *)pbVar20);
          }
          else {
            if (uVar4 != 1) {
              if (uVar4 < 8) {
                pbVar9[0] = 0;
                pbVar9[1] = 0;
                pbVar9[2] = 0;
                pbVar9[3] = 0;
                *pbVar9 = *pbVar20;
                pbVar9[1] = pbVar20[1];
                pbVar9[2] = pbVar20[2];
                pbVar9[3] = pbVar20[3];
                uVar8 = inc32table[uVar4];
                *(undefined4 *)(pbVar9 + 4) = *(undefined4 *)(pbVar20 + uVar8);
                pbVar20 = pbVar20 + ((ulong)uVar8 - (long)dec64table[uVar4]);
              }
              else {
                *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
                pbVar20 = pbVar20 + 8;
              }
              pbVar9 = pbVar9 + 8;
              do {
                *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
                pbVar9 = pbVar9 + 8;
                pbVar20 = pbVar20 + 8;
              } while (pbVar9 < __dest);
              goto LAB_0010df6f;
            }
            iVar13 = (uint)*pbVar20 * 0x1010101;
          }
          do {
            *(int *)pbVar9 = iVar13;
            *(int *)(pbVar9 + 4) = iVar13;
            pbVar9 = pbVar9 + 8;
          } while (pbVar9 < __dest);
          goto LAB_0010df6f;
        }
        do {
          uVar5 = *(undefined8 *)(pbVar9 + -uVar21 + 8);
          *(undefined8 *)pbVar9 = *(undefined8 *)(pbVar9 + -uVar21);
          *(undefined8 *)(pbVar9 + 8) = uVar5;
          uVar5 = *(undefined8 *)(pbVar9 + -uVar21 + 0x10 + 8);
          *(undefined8 *)(pbVar9 + 0x10) = *(undefined8 *)(pbVar9 + -uVar21 + 0x10);
          *(undefined8 *)(pbVar9 + 0x18) = uVar5;
          pbVar9 = pbVar9 + 0x20;
        } while (pbVar9 < __dest);
      } while( true );
    }
  }
  return iVar13;
LAB_0010e3e1:
  if (pbVar20 < dest) {
LAB_0010e248:
    return ~(uint)__src + (int)source;
  }
  __dest = pbVar9 + uVar18;
  if ((uint)uVar21 < 8) {
    pbVar9[0] = 0;
    pbVar9[1] = 0;
    pbVar9[2] = 0;
    pbVar9[3] = 0;
    *pbVar9 = *pbVar20;
    pbVar9[1] = pbVar20[1];
    pbVar9[2] = pbVar20[2];
    pbVar9[3] = pbVar20[3];
    uVar21 = (ulong)((uint)uVar21 << 2);
    uVar17 = (ulong)*(uint *)((long)inc32table + uVar21);
    *(undefined4 *)(pbVar9 + 4) = *(undefined4 *)(pbVar20 + uVar17);
    pbVar20 = pbVar20 + (uVar17 - (long)*(int *)((long)dec64table + uVar21));
  }
  else {
    *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
    pbVar20 = pbVar20 + 8;
  }
  pbVar10 = pbVar9 + 8;
  puVar15 = __src;
  if (pbVar2 + -0xc < __dest) {
    if (pbVar2 + -5 < __dest) goto LAB_0010e248;
    pbVar9 = pbVar2 + -7;
    pbVar12 = pbVar20;
    pbVar14 = pbVar10;
    if (pbVar10 < pbVar9) {
      do {
        *(undefined8 *)pbVar14 = *(undefined8 *)pbVar12;
        pbVar14 = pbVar14 + 8;
        pbVar12 = pbVar12 + 8;
      } while (pbVar14 < pbVar9);
      pbVar20 = pbVar20 + ((long)pbVar9 - (long)pbVar10);
      pbVar10 = pbVar9;
    }
    for (; pbVar10 < __dest; pbVar10 = pbVar10 + 1) {
      bVar3 = *pbVar20;
      pbVar20 = pbVar20 + 1;
      *pbVar10 = bVar3;
    }
  }
  else {
    *(undefined8 *)pbVar10 = *(undefined8 *)pbVar20;
    if (0x10 < uVar18) {
      pbVar9 = pbVar9 + 0x10;
      do {
        pbVar20 = pbVar20 + 8;
        *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
        pbVar9 = pbVar9 + 8;
      } while (pbVar9 < __dest);
    }
  }
LAB_0010e2c5:
  while( true ) {
    __src = (ushort *)((long)puVar15 + 1);
    bVar3 = (byte)*puVar15;
    uVar21 = (ulong)(uint)(bVar3 >> 4);
    if (bVar3 >> 4 == 0xf) break;
    if ((source + (long)compressedSize + -0x10 <= __src) ||
       (dest + (long)maxDecompressedSize + -0x20 < __dest)) goto LAB_0010e333;
    uVar5 = *(undefined8 *)((long)puVar15 + 9);
    *(undefined8 *)__dest = *(undefined8 *)__src;
    *(undefined8 *)(__dest + 8) = uVar5;
    pbVar9 = __dest + uVar21;
    uVar18 = (ulong)(bVar3 & 0xf);
    puVar15 = (ushort *)((long)__src + uVar21);
    __src = puVar15 + 1;
    uVar4 = *puVar15;
    uVar21 = (ulong)uVar4;
    pbVar20 = pbVar9 + -uVar21;
    if (((uVar18 == 0xf) || (uVar4 < 8)) || (pbVar20 < dest)) goto LAB_0010e385;
    *(undefined8 *)pbVar9 = *(undefined8 *)pbVar20;
    *(undefined8 *)(pbVar9 + 8) = *(undefined8 *)(pbVar20 + 8);
    *(undefined2 *)(pbVar9 + 0x10) = *(undefined2 *)(pbVar20 + 0x10);
    __dest = pbVar9 + uVar18 + 4;
    puVar15 = __src;
  }
  if ((ushort *)((long)puVar1 - 0xfU) <= __src) goto LAB_0010e248;
  puVar15 = puVar15 + 1;
  uVar8 = 0;
  do {
    uVar4 = *__src;
    __src = (ushort *)((long)__src + 1);
    uVar8 = uVar8 + (byte)uVar4;
    puVar15 = (ushort *)((long)puVar15 + 1);
  } while (__src < (ushort *)((long)puVar1 - 0xfU) && (byte)uVar4 == 0xff);
  uVar21 = (ulong)uVar8 + 0xf;
  if ((CARRY8((ulong)__dest,uVar21)) || ((ulong)-(long)puVar15 < uVar21)) goto LAB_0010e248;
LAB_0010e333:
  pbVar9 = __dest + uVar21;
LAB_0010e337:
  puVar15 = (ushort *)((long)__src + uVar21);
  if ((pbVar2 + -0xc < pbVar9) || (puVar1 + -4 < puVar15)) {
    if ((puVar15 == puVar1) && (pbVar9 <= pbVar2)) {
      memmove(__dest,__src,uVar21);
      return ((int)__dest + (int)uVar21) - (int)dest;
    }
    goto LAB_0010e248;
  }
  do {
    *(undefined8 *)__dest = *(undefined8 *)__src;
    __dest = __dest + 8;
    __src = __src + 4;
  } while (__dest < pbVar9);
  uVar21 = (ulong)*puVar15;
  __src = puVar15 + 1;
  pbVar20 = pbVar9 + -uVar21;
  uVar18 = (ulong)(bVar3 & 0xf);
LAB_0010e385:
  if ((int)uVar18 == 0xf) {
    uVar8 = 0;
    do {
      uVar4 = *__src;
      __src = (ushort *)((long)__src + 1);
      uVar8 = uVar8 + (byte)uVar4;
    } while ((byte)uVar4 == 0xff && __src < puVar1 + -2);
    uVar18 = (ulong)uVar8 + 0xf;
    if ((puVar1 + -2 <= __src) || (CARRY8((ulong)pbVar9,uVar18))) goto LAB_0010e248;
  }
  uVar18 = uVar18 + 4;
  goto LAB_0010e3e1;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe(const char* source, char* dest, int compressedSize, int maxDecompressedSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxDecompressedSize,
                                  endOnInputSize, decode_full_block, noDict,
                                  (BYTE*)dest, NULL, 0);
}